

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int markpara(int f,int n)

{
  int iVar1;
  int local_18;
  int local_14;
  int i;
  int n_local;
  int f_local;
  
  local_18 = 0;
  if (n != 0) {
    local_14 = n;
    i = f;
    clearmark(7,0);
    iVar1 = findpara();
    if (iVar1 != 0) {
      do_gotoeop(8,local_14,&local_18);
      curwp->w_markp = curwp->w_dotp;
      curwp->w_marko = curwp->w_doto;
      gotobop(8,local_18);
    }
  }
  return 1;
}

Assistant:

int
markpara(int f, int n)
{
	int i = 0;

	if (n == 0)
		return (TRUE);

	clearmark(FFARG, 0);

	if (findpara() == FALSE)
		return (TRUE);

	(void)do_gotoeop(FFRAND, n, &i);

	/* set the mark here */
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;

	(void)gotobop(FFRAND, i);

	return (TRUE);
}